

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall jessilib::thread_pool::thread_pool(thread_pool *this,size_t in_threads)

{
  type local_50;
  thread local_40;
  reference local_38;
  thread *worker;
  allocator<jessilib::thread_pool::thread> local_19;
  size_t local_18;
  size_t in_threads_local;
  thread_pool *this_local;
  
  local_18 = in_threads;
  in_threads_local = (size_t)this;
  std::allocator<jessilib::thread_pool::thread>::allocator(&local_19);
  std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::vector
            (&this->m_threads,in_threads,&local_19);
  std::allocator<jessilib::thread_pool::thread>::~allocator(&local_19);
  std::
  queue<jessilib::thread_pool::thread*,std::deque<jessilib::thread_pool::thread*,std::allocator<jessilib::thread_pool::thread*>>>
  ::
  queue<std::deque<jessilib::thread_pool::thread*,std::allocator<jessilib::thread_pool::thread*>>,void>
            ((queue<jessilib::thread_pool::thread*,std::deque<jessilib::thread_pool::thread*,std::allocator<jessilib::thread_pool::thread*>>>
              *)&this->m_inactive_threads);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->m_tasks);
  std::mutex::mutex(&this->m_threads_mutex);
  std::mutex::mutex(&this->m_inactive_threads_mutex);
  std::mutex::mutex(&this->m_tasks_mutex);
  if (local_18 == 0) {
    __assert_fail("in_threads != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/thread_pool.cpp"
                  ,0x27,"jessilib::thread_pool::thread_pool(size_t)");
  }
  while (local_18 != 0) {
    local_18 = local_18 - 1;
    local_50.worker =
         std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
         ::operator[](&this->m_threads,local_18);
    local_50.this = this;
    local_38 = local_50.worker;
    std::thread::thread<jessilib::thread_pool::thread_pool(unsigned_long)::__0,,void>
              (&local_40,&local_50);
    std::thread::operator=(&local_38->m_thread,&local_40);
    std::thread::~thread(&local_40);
  }
  return;
}

Assistant:

thread_pool::thread_pool(size_t in_threads)
	: m_threads{ in_threads } {
	assert(in_threads != 0);

	while (in_threads != 0) {
		thread& worker = m_threads[--in_threads];
		worker.m_thread = std::thread([this, &worker]() {
			while (true) {
				// Run next pending task, if there is any
				worker.m_task = pop_task();
				if (worker.m_task != nullptr) {
					worker.run_task();
					continue;
				}

				{
					// Check if we're shutting down
					std::unique_lock<std::mutex> notifier_guard(worker.m_notifier_mutex);
					if (worker.m_shutdown) {
						break;
					}

					// Push inactive thread
					{
						std::lock_guard<std::mutex> inactive_threads_guard(m_inactive_threads_mutex);
						m_inactive_threads.push(&worker);
					}

					// Wait for notification
					worker.m_notifier.wait(notifier_guard);
				}

				// Run task
				worker.run_task();
			}
		});
	}
}